

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O0

void __thiscall
ModelTestFixture_testSizeZeroWithoutSave_Test::TestBody
          (ModelTestFixture_testSizeZeroWithoutSave_Test *this)

{
  bool bVar1;
  map<int,_Mock,_std::less<int>,_std::allocator<std::pair<const_int,_Mock>_>_> *this_00;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  int local_44;
  size_type local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Mock object;
  ModelTestFixture_testSizeZeroWithoutSave_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Mock::Mock((Mock *)&gtest_ar.message_);
  this_00 = Model<Mock>::all();
  local_40 = std::map<int,_Mock,_std::less<int>,_std::allocator<std::pair<const_int,_Mock>_>_>::size
                       (this_00);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_38,"Mock::all().size()","0",&local_40,&local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x1a,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testSizeZeroWithoutSave) {
    Mock object = Mock();
    ASSERT_EQ(Mock::all().size(), 0);
}